

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O1

man_page *
clipp::make_man_page
          (man_page *__return_storage_ptr__,group *cli,doc_string *progname,doc_formatting *fmt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Any_data _Stack_698;
  code *local_688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_678;
  string local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  string local_618;
  string local_5f8;
  param_filter local_5d8;
  documentation local_5a8;
  
  __return_storage_ptr__->sectionSpc_ = 1;
  (__return_storage_ptr__->sections_).
  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->sections_).
  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->sections_).
  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->progName_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->progName_).field_2;
  (__return_storage_ptr__->progName_)._M_string_length = 0;
  (__return_storage_ptr__->progName_).field_2._M_local_buf[0] = '\0';
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_638,"SYNOPSIS","");
  pcVar2 = (progname->_M_dataplus)._M_p;
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_658,pcVar2,pcVar2 + progname->_M_string_length);
  usage_lines::usage_lines((usage_lines *)&local_5a8,cli,&local_658,fmt);
  usage_lines::str_abi_cxx11_(&local_5f8,(usage_lines *)&local_5a8);
  std::vector<clipp::man_page::section,std::allocator<clipp::man_page::section>>::
  emplace_back<std::__cxx11::string,std::__cxx11::string>
            ((vector<clipp::man_page::section,std::allocator<clipp::man_page::section>> *)
             &__return_storage_ptr__->sections_,&local_638,&local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._M_dataplus._M_p != &local_5f8.field_2) {
    operator_delete(local_5f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a8.usgFmt_.paramSep_._M_dataplus._M_p != &local_5a8.usgFmt_.paramSep_.field_2) {
    operator_delete(local_5a8.usgFmt_.paramSep_._M_dataplus._M_p);
  }
  doc_formatting::~doc_formatting(&local_5a8.fmt_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p);
  }
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_678,"OPTIONS","");
  paVar1 = &local_5d8.prefix_.field_2;
  local_5d8.prefix_.field_2._8_8_ = 0;
  local_5d8.prefix_._M_string_length = 0;
  local_5d8.prefix_.field_2._M_allocated_capacity = 0;
  local_5d8.required_ = either;
  local_5d8.blocking_ = either;
  local_5d8.repeatable_ = either;
  local_5d8.hasDoc_ = yes;
  local_5d8._36_4_ = 0;
  local_5d8.prefix_._M_dataplus._M_p = (pointer)paVar1;
  std::function<bool(clipp::parameter_const&)>::function<clipp::param_filter,void>
            ((function<bool(clipp::parameter_const&)> *)_Stack_698._M_pod_data,&local_5d8);
  documentation::documentation(&local_5a8,cli,fmt,(filter_function *)&_Stack_698);
  documentation::str_abi_cxx11_(&local_618,&local_5a8);
  std::vector<clipp::man_page::section,std::allocator<clipp::man_page::section>>::
  emplace_back<std::__cxx11::string,std::__cxx11::string>
            ((vector<clipp::man_page::section,std::allocator<clipp::man_page::section>> *)
             &__return_storage_ptr__->sections_,&local_678,&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_618._M_dataplus._M_p != &local_618.field_2) {
    operator_delete(local_618._M_dataplus._M_p);
  }
  if (local_5a8.filter_.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_5a8.filter_.super__Function_base._M_manager)
              ((_Any_data *)&local_5a8.filter_,(_Any_data *)&local_5a8.filter_,__destroy_functor);
  }
  doc_formatting::~doc_formatting(&local_5a8.usgFmt_);
  doc_formatting::~doc_formatting(&local_5a8.fmt_);
  if (local_688 != (code *)0x0) {
    (*local_688)(&_Stack_698,&_Stack_698,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8.prefix_._M_dataplus._M_p != paVar1) {
    operator_delete(local_5d8.prefix_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline man_page
make_man_page(const group& cli,
              doc_string progname = "",
              const doc_formatting& fmt = doc_formatting{})
{
    man_page man;
    man.append_section("SYNOPSIS", usage_lines(cli,progname,fmt).str());
    man.append_section("OPTIONS", documentation(cli,fmt).str());
    return man;
}